

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O3

void __thiscall avro::SymbolicSchema::SymbolicSchema(SymbolicSchema *this,Name *name,NodePtr *link)

{
  NodeSymbolic *this_00;
  NodePtr local_78;
  SingleAttribute<avro::Name> local_68;
  
  this_00 = (NodeSymbolic *)operator_new(0x68);
  concepts::SingleAttribute<avro::Name>::SingleAttribute(&local_68,name);
  local_78.px = link->px;
  local_78.pn.pi_ = (link->pn).pi_;
  if (local_78.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_78.pn.pi_)->use_count_ = (local_78.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  NodeSymbolic::NodeSymbolic(this_00,&local_68,&local_78);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00193380;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>(&(this->super_Schema).node_,(Node *)this_00)
  ;
  boost::detail::shared_count::~shared_count(&local_78.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.attr_.simpleName_._M_dataplus._M_p != &local_68.attr_.simpleName_.field_2) {
    operator_delete(local_68.attr_.simpleName_._M_dataplus._M_p,
                    local_68.attr_.simpleName_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.attr_.ns_._M_dataplus._M_p != &local_68.attr_.ns_.field_2) {
    operator_delete(local_68.attr_.ns_._M_dataplus._M_p,
                    local_68.attr_.ns_.field_2._M_allocated_capacity + 1);
  }
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00193470;
  return;
}

Assistant:

SymbolicSchema::SymbolicSchema(const Name &name, const NodePtr& link) :
    Schema(new NodeSymbolic(HasName(name), link))
{
}